

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void EvaluatePolicy(CMDP *PolicyMDP,int StartStateID,int GoalStateID,double *PolValue,
                   bool *bFullPolicy,double *Pcgoal,int *nMerges,bool *bCycles)

{
  CMDPSTATE *sourcestate;
  pointer ppCVar1;
  bool bVar2;
  int iVar3;
  void *__s;
  void *pvVar4;
  CMDPACTION *pCVar5;
  runtime_error *this;
  SBPL_Exception *this_00;
  CMDPSTATE *targetstate;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  pointer ppCVar11;
  pointer ppCVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  undefined8 uVar17;
  double dVar18;
  double dVar19;
  stringstream ss;
  double local_210;
  long local_200;
  long *local_1f0 [2];
  long local_1e0 [2];
  double *local_1d0;
  double *local_1c8;
  long local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  *Pcgoal = 0.0;
  *nMerges = 0;
  ppCVar12 = (PolicyMDP->StateArray).super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar11 = (PolicyMDP->StateArray).super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)ppCVar11 - (long)ppCVar12 >> 3;
  uVar13 = -(ulong)(uVar7 >> 0x3d != 0) | (long)ppCVar11 - (long)ppCVar12;
  local_1d0 = PolValue;
  local_1c8 = Pcgoal;
  __s = operator_new__(uVar13);
  pvVar4 = operator_new__(uVar13);
  uVar6 = (uint)uVar7;
  if ((int)uVar6 < 1) {
    local_200 = -1;
  }
  else {
    uVar13 = (ulong)(uVar6 & 0x7fffffff);
    uVar14 = 0;
    memset(__s,0,uVar13 * 8);
    uVar7 = 0xffffffff;
    do {
      uVar17 = 0x3ff0000000000000;
      bVar16 = ppCVar12[uVar14]->StateID != StartStateID;
      if (bVar16) {
        uVar17 = 0;
      }
      *(undefined8 *)((long)pvVar4 + uVar14 * 8) = uVar17;
      if (!bVar16) {
        uVar7 = uVar14 & 0xffffffff;
      }
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
    local_200 = (long)(int)uVar7;
  }
  *bFullPolicy = true;
  bVar16 = true;
  while (uVar7 = (ulong)((long)ppCVar11 - (long)ppCVar12) >> 3, 0 < (int)uVar7) {
    local_210 = 0.0;
    lVar10 = 0;
    do {
      sourcestate = ppCVar12[lVar10];
      iVar3 = sourcestate->StateID;
      if (iVar3 == GoalStateID) {
        *(undefined8 *)((long)__s + lVar10 * 8) = 0;
      }
      else {
        ppCVar1 = (sourcestate->Actions).
                  super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(sourcestate->Actions).
                                super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1) >> 3) ==
            0) {
          *bFullPolicy = false;
          *(undefined8 *)((long)__s + lVar10 * 8) = 0x412e848000000000;
          goto LAB_00141d8d;
        }
        pCVar5 = *ppCVar1;
        lVar15 = *(long *)&(pCVar5->SuccsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data;
        uVar6 = (uint)((ulong)((long)*(pointer *)
                                      ((long)&(pCVar5->SuccsID).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      + 8) - lVar15) >> 2);
        if ((int)uVar6 < 1) {
          dVar18 = 0.0;
        }
        else {
          dVar18 = 0.0;
          uVar13 = 0;
          do {
            if ((int)uVar7 < 1) {
              uVar14 = 0;
            }
            else {
              uVar14 = 0;
              while (ppCVar12[uVar14]->StateID != *(int *)(lVar15 + uVar13 * 4)) {
                uVar14 = uVar14 + 1;
                if ((uVar7 & 0xffffffff) == uVar14) goto LAB_00141db7;
              }
            }
            if ((int)uVar14 == (int)uVar7) {
LAB_00141db7:
              local_1f0[0] = local_1e0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f0,"ERROR in EvaluatePolicy: incorrect successor ","");
              std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_1f0,_S_out|_S_in);
              if (local_1f0[0] != local_1e0) {
                operator_delete(local_1f0[0],local_1e0[0] + 1);
              }
              std::ostream::operator<<
                        (local_1a8,
                         *(int *)(*(long *)&(pCVar5->SuccsID).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data + (uVar13 & 0xffffffff) * 4));
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(this,(string *)local_1f0);
              *(undefined ***)this = &PTR__runtime_error_00157508;
              __cxa_throw(this,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
            }
            dVar18 = dVar18 + ((double)*(int *)(*(long *)&(pCVar5->Costs).
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + uVar13 * 4) +
                              *(double *)((long)__s + (uVar14 & 0xffffffff) * 8)) *
                              (double)*(float *)(*(long *)&(pCVar5->SuccsProb).
                                                                                                                      
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + uVar13 * 4);
            uVar13 = uVar13 + 1;
          } while (uVar13 != (uVar6 & 0x7fffffff));
        }
        dVar19 = *(double *)((long)__s + lVar10 * 8);
        if (dVar18 < dVar19) {
          this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
          SBPL_Exception::SBPL_Exception(this_00,"ERROR in EvaluatePolicy: val is decreasing");
          __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        dVar19 = dVar18 - dVar19;
        if (dVar19 <= local_210) {
          dVar19 = local_210;
        }
        *(double *)((long)__s + lVar10 * 8) = dVar18;
        local_210 = dVar19;
      }
      if ((int)((ulong)((long)ppCVar11 - (long)ppCVar12) >> 3) < 1) {
        iVar9 = 0;
        dVar18 = 0.0;
      }
      else {
        dVar18 = 0.0;
        lVar15 = 0;
        iVar9 = 0;
        local_1c0 = lVar10;
        do {
          targetstate = ppCVar12[lVar15];
          ppCVar1 = (targetstate->Actions).
                    super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (0 < (int)((ulong)((long)(targetstate->Actions).
                                      super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1) >>
                       3)) {
            pCVar5 = *ppCVar1;
            lVar10 = *(long *)&(pCVar5->SuccsID).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data;
            if (0xffffffff <
                ((long)*(pointer *)
                        ((long)&(pCVar5->SuccsID).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl + 8) - lVar10) * 0x40000000) {
              lVar8 = 0;
              do {
                if (*(int *)(lVar10 + lVar8 * 4) == sourcestate->StateID) {
                  dVar18 = dVar18 + (double)*(float *)(*(long *)&(pCVar5->SuccsProb).
                                                                                                                                  
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar8 * 4) *
                                    *(double *)((long)pvVar4 + lVar15 * 8);
                  iVar9 = iVar9 + 1;
                  if (((bVar16) && (*bCycles == false)) &&
                     (bVar2 = PathExists(PolicyMDP,sourcestate,targetstate), bVar2)) {
                    *bCycles = true;
                  }
                }
                ppCVar12 = (PolicyMDP->StateArray).
                           super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                           super__Vector_impl_data._M_start;
                targetstate = ppCVar12[lVar15];
                ppCVar1 = (targetstate->Actions).
                          super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if ((int)((ulong)((long)(targetstate->Actions).
                                        super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1)
                         >> 3) < 1) break;
                lVar8 = lVar8 + 1;
                pCVar5 = *ppCVar1;
                lVar10 = *(long *)&(pCVar5->SuccsID).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data;
              } while (lVar8 < (int)((ulong)((long)*(pointer *)
                                                    ((long)&(pCVar5->SuccsID).
                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - lVar10) >> 2));
            }
            ppCVar11 = (PolicyMDP->StateArray).
                       super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < (int)((ulong)((long)ppCVar11 - (long)ppCVar12) >> 3));
        iVar3 = sourcestate->StateID;
        lVar10 = local_1c0;
      }
      if (((bVar16) && (iVar3 != GoalStateID)) && (0 < iVar9)) {
        *nMerges = *nMerges + iVar9 + -1;
        iVar3 = sourcestate->StateID;
      }
      if (iVar3 != StartStateID) {
        *(double *)((long)pvVar4 + lVar10 * 8) = dVar18;
      }
      if (iVar3 == GoalStateID) {
        *local_1c8 = *(double *)((long)pvVar4 + lVar10 * 8);
      }
      lVar10 = lVar10 + 1;
      uVar7 = (ulong)((long)ppCVar11 - (long)ppCVar12) >> 3;
    } while (lVar10 < (int)uVar7);
    bVar16 = false;
    if (local_210 <= 0.1) break;
  }
LAB_00141d8d:
  *local_1d0 = *(double *)((long)__s + local_200 * 8);
  return;
}

Assistant:

void EvaluatePolicy(CMDP* PolicyMDP, int StartStateID, int GoalStateID, double* PolValue, bool *bFullPolicy,
                    double* Pcgoal, int *nMerges, bool* bCycles)
{
    int i, j, startind = -1;
    double delta = INFINITECOST;
    double mindelta = 0.1;

    *Pcgoal = 0;
    *nMerges = 0;

    SBPL_PRINTF("Evaluating policy...\n");

    //create and initialize values
    double* vals = new double[PolicyMDP->StateArray.size()];
    double* Pcvals = new double[PolicyMDP->StateArray.size()];
    for (i = 0; i < (int)PolicyMDP->StateArray.size(); i++) {
        vals[i] = 0;
        Pcvals[i] = 0;

        //remember the start index
        if (PolicyMDP->StateArray[i]->StateID == StartStateID) {
            startind = i;
            Pcvals[i] = 1;
        }
    }

    //initially assume full policy
    *bFullPolicy = true;
    bool bFirstIter = true;
    while (delta > mindelta) {
        delta = 0;
        for (i = 0; i < (int)PolicyMDP->StateArray.size(); i++) {
            //get the state
            CMDPSTATE* state = PolicyMDP->StateArray[i];

            //do the backup for values
            if (state->StateID == GoalStateID) {
                vals[i] = 0;
            }
            else if ((int)state->Actions.size() == 0) {
                *bFullPolicy = false;
                vals[i] = UNKNOWN_COST;
                *PolValue = vals[startind];
                return;
            }
            else {
                //normal backup
                CMDPACTION* action = state->Actions[0];

                //do backup
                double Q = 0;
                for (int oind = 0; oind < (int)action->SuccsID.size(); oind++) {
                    //get the state
                    for (j = 0; j < (int)PolicyMDP->StateArray.size(); j++) {
                        if (PolicyMDP->StateArray[j]->StateID == action->SuccsID[oind]) break;
                    }
                    if (j == (int)PolicyMDP->StateArray.size()) {
                        std::stringstream ss("ERROR in EvaluatePolicy: incorrect successor ");
                        ss << action->SuccsID[oind];
                        throw SBPL_Exception(ss.str());
                    }
                    Q += action->SuccsProb[oind] * (vals[j] + action->Costs[oind]);
                }

                if (vals[i] > Q) {
                    throw SBPL_Exception("ERROR in EvaluatePolicy: val is decreasing");
                }

                //update delta
                if (delta < Q - vals[i]) delta = Q - vals[i];

                //set the value
                vals[i] = Q;
            }

            //iterate through all the predecessors and compute Pc
            double Pc = 0;
            //go over all predecessor states
            int nMerge = 0;
            for (j = 0; j < (int)PolicyMDP->StateArray.size(); j++) {
                for (int oind = 0; (int)PolicyMDP->StateArray[j]->Actions.size() > 0 &&
                                   oind < (int)PolicyMDP->StateArray[j]->Actions[0]->SuccsID.size(); oind++)
                {
                    if (PolicyMDP->StateArray[j]->Actions[0]->SuccsID[oind] == state->StateID) {
                        //process the predecessor
                        double PredPc = Pcvals[j];
                        double OutProb = PolicyMDP->StateArray[j]->Actions[0]->SuccsProb[oind];

                        //accumulate into Pc
                        Pc = Pc + OutProb * PredPc;
                        nMerge++;

                        //check for cycles
                        if (bFirstIter && !(*bCycles)) {
                            if (PathExists(PolicyMDP, state, PolicyMDP->StateArray[j])) *bCycles = true;
                        }
                    }
                }
            }
            if (bFirstIter && state->StateID != GoalStateID && nMerge > 0) *nMerges += (nMerge - 1);

            //assign Pc
            if (state->StateID != StartStateID) Pcvals[i] = Pc;

            if (state->StateID == GoalStateID) *Pcgoal = Pcvals[i];
        } //over  states
        bFirstIter = false;
    } //until delta small

    *PolValue = vals[startind];

    SBPL_PRINTF("done\n");
}